

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_distance_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float sqSum;
  float fVar2;
  Vector<float,_3> res;
  float local_30 [4];
  float local_20 [3];
  undefined8 local_14;
  float local_c;
  
  local_20[0] = c->in[0].m_data[2];
  local_20[1] = c->in[0].m_data[0];
  local_20[2] = c->in[0].m_data[1];
  local_14 = *(undefined8 *)(c->in[1].m_data + 1);
  local_c = c->in[1].m_data[0];
  local_30[2] = 0.0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  lVar1 = 0;
  do {
    local_30[lVar1] = local_20[lVar1] - *(float *)((long)&local_14 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar2 = fVar2 + local_30[lVar1] * local_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }